

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

Options * __thiscall
ApprovalTests::Options::withReporter
          (Options *__return_storage_ptr__,Options *this,Reporter *reporter)

{
  bool usingDefaultScrubber;
  __shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [40];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_48;
  
  FileOptions::FileOptions((FileOptions *)local_70,&this->fileOptions_);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_48,&this->scrubber_);
  usingDefaultScrubber = this->usingDefaultScrubber_;
  ::std::__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             &(this->namer_).
              super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>);
  Options(__return_storage_ptr__,(FileOptions *)local_70,&local_48,reporter,usingDefaultScrubber,
          (shared_ptr<ApprovalTests::ApprovalNamer> *)&local_80);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_refcount);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  ::std::__cxx11::string::~string((string *)(local_70 + 8));
  return __return_storage_ptr__;
}

Assistant:

Options Options::withReporter(const Reporter& reporter) const
    {
        return Options(fileOptions_, scrubber_, reporter, usingDefaultScrubber_, namer_);
    }